

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  uint uVar2;
  ImGuiStyle *pIVar3;
  float lhs;
  char *unaff_retaddr;
  char *in_stack_00000008;
  ImGuiTableColumnFlags flags;
  int column_n;
  int columns_count;
  float row_height;
  int in_stack_ffffffffffffffe0;
  ImVec2 in_stack_ffffffffffffffe8;
  int local_c;
  float fVar4;
  
  lhs = GetTextLineHeight();
  fVar1 = (float)TableGetColumnCount();
  for (local_c = 0; local_c < (int)fVar1; local_c = local_c + 1) {
    uVar2 = TableGetColumnFlags(in_stack_ffffffffffffffe0);
    if (((uVar2 & 0x1000000) != 0) && ((uVar2 & 0x1000) == 0)) {
      fVar4 = lhs;
      TableGetColumnName((int)in_stack_ffffffffffffffe8.y);
      in_stack_ffffffffffffffe8 =
           CalcTextSize(in_stack_00000008,unaff_retaddr,SUB41((uint)fVar4 >> 0x18,0),fVar1);
      lhs = ImMax<float>(lhs,in_stack_ffffffffffffffe8.y);
    }
  }
  pIVar3 = GetStyle();
  fVar1 = (pIVar3->CellPadding).y;
  return fVar1 + fVar1 + lhs;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        ImGuiTableColumnFlags flags = TableGetColumnFlags(column_n);
        if ((flags & ImGuiTableColumnFlags_IsEnabled) && !(flags & ImGuiTableColumnFlags_NoHeaderLabel))
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    }
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}